

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralActivity::~IfcStructuralActivity
          (IfcStructuralActivity *this,void **vtt)

{
  void *pvVar1;
  
  pvVar1 = *vtt;
  *(void **)&(this->super_IfcProduct).super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcProduct).super_IfcObject.field_0x0 + *(long *)((long)pvVar1 + -0x18))
       = vtt[0x19];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0x88 = vtt[0x1a];
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = vtt[0x1c];
  *(void **)&(this->super_IfcProduct).field_0x100 = vtt[0x1d];
  std::__cxx11::string::~string((string *)&this->GlobalOrLocal);
  IfcObject::~IfcObject((IfcObject *)this,vtt + 2);
  return;
}

Assistant:

IfcStructuralActivity() : Object("IfcStructuralActivity") {}